

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_tt__handle_clipped_edge
               (float *scanline,int x,nk_tt__active_edge *e,float x0,float y0,float x1,float y1)

{
  float fVar1;
  float fVar2;
  
  if ((y0 != y1) || (NAN(y0) || NAN(y1))) {
    if (y1 <= y0) {
      __assert_fail("y0 < y1",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x2d98,
                    "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                   );
    }
    fVar1 = e->sy;
    fVar2 = e->ey;
    if (fVar2 < fVar1) {
      __assert_fail("e->sy <= e->ey",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x2d99,
                    "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                   );
    }
    if ((fVar1 <= y1) && (y0 <= fVar2)) {
      if (y0 < fVar1) {
        x0 = x0 + ((fVar1 - y0) * (x1 - x0)) / (y1 - y0);
        y0 = fVar1;
      }
      if (fVar2 < y1) {
        x1 = x1 + ((fVar2 - y1) * (x1 - x0)) / (y1 - y0);
        y1 = fVar2;
      }
      fVar1 = (float)x;
      fVar2 = (float)(x + 1);
      if ((x0 != fVar1) || (NAN(x0) || NAN(fVar1))) {
        if ((x0 != fVar2) || (NAN(x0) || NAN(fVar2))) {
          if (x0 <= fVar1) {
            if (fVar1 < x1) {
              __assert_fail("x1 <= x",
                            "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                            ,0x2da7,
                            "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                           );
            }
          }
          else if (fVar2 <= x0) {
            if (x1 < fVar2) {
              __assert_fail("x1 >= x+1",
                            "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                            ,0x2da8,
                            "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                           );
            }
          }
          else if ((x1 < fVar1) || (fVar2 < x1)) {
            __assert_fail("x1 >= x && x1 <= x+1",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x2da9,
                          "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                         );
          }
        }
        else if (x1 < fVar1) {
          __assert_fail("x1 >= x",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x2da6,
                        "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                       );
        }
      }
      else if (fVar2 < x1) {
        __assert_fail("x1 <= x+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x2da5,
                      "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                     );
      }
      if ((fVar1 < x0) || (fVar1 < x1)) {
        if ((x0 < fVar2) || (x1 < fVar2)) {
          if ((((x0 < fVar1) || (fVar2 < x0)) || (x1 < fVar1)) || (fVar2 < x1)) {
            __assert_fail("x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x2daf,
                          "void nk_tt__handle_clipped_edge(float *, int, struct nk_tt__active_edge *, float, float, float, float)"
                         );
          }
          scanline[x] = (((x1 - fVar1) + (x0 - fVar1)) * -0.5 + 1.0) * (y1 - y0) * e->direction +
                        scanline[x];
        }
      }
      else {
        scanline[x] = (y1 - y0) * e->direction + scanline[x];
      }
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_tt__handle_clipped_edge(float *scanline, int x, struct nk_tt__active_edge *e,
    float x0, float y0, float x1, float y1)
{
    if (y0 == y1) return;
    NK_ASSERT(y0 < y1);
    NK_ASSERT(e->sy <= e->ey);
    if (y0 > e->ey) return;
    if (y1 < e->sy) return;
    if (y0 < e->sy) {
        x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
        y0 = e->sy;
    }
    if (y1 > e->ey) {
        x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
        y1 = e->ey;
    }

    if (x0 == x) NK_ASSERT(x1 <= x+1);
    else if (x0 == x+1) NK_ASSERT(x1 >= x);
    else if (x0 <= x) NK_ASSERT(x1 <= x);
    else if (x0 >= x+1) NK_ASSERT(x1 >= x+1);
    else NK_ASSERT(x1 >= x && x1 <= x+1);

    if (x0 <= x && x1 <= x)
        scanline[x] += e->direction * (y1-y0);
    else if (x0 >= x+1 && x1 >= x+1);
    else {
        NK_ASSERT(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
        /* coverage = 1 - average x position */
        scanline[x] += (float)e->direction * (float)(y1-y0) * (1.0f-((x0-(float)x)+(x1-(float)x))/2.0f);
    }
}